

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O2

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_TypedFoo_DISABLED__x_iutest_x_Bar_Test,_iutest::detail::VariadicTypeList<int>_>
::TypeParamTestInstance
          (TypeParamTestInstance<iu_TypedFoo_DISABLED__x_iutest_x_Bar_Test,_iutest::detail::VariadicTypeList<int>_>
           *this,string *testsuite,char *name,char *file,int line)

{
  EachTest<iutest::detail::VariadicTypeList<int>,_void>::EachTest
            (&this->m_tests,testsuite,name,0,file,line);
  EachTest<iutest::detail::VariadicTypeList<int>,_void>::AddTest(&this->m_tests);
  return;
}

Assistant:

TypeParamTestInstance(const std::string& testsuite, const char* name, const char* file, int line)
        : m_tests(testsuite, name, 0, file, line)
    {
        m_tests.AddTest();
    }